

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileImporter::InternReadFile
          (ObjFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  Model *pModel;
  undefined4 extraout_var_02;
  long *plVar5;
  runtime_error *prVar6;
  __uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *p_Var7;
  string folderName;
  string modelName;
  IOStreamBuffer<char> streamedBuffer;
  ObjFileParser parser;
  undefined1 *local_1118;
  long local_1110;
  undefined1 local_1108 [16];
  string local_10f8;
  undefined1 local_10d8 [32];
  size_t sStack_10b8;
  vector<char,_std::allocator<char>_> local_10b0;
  size_t sStack_1098;
  size_t local_1090;
  ObjFileParser local_1080;
  IOStream *pIVar3;
  
  if (InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::mode_abi_cxx11_ ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)
                                 ::mode_abi_cxx11_);
    if (iVar2 != 0) {
      InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::mode_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                     mode_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                  mode_abi_cxx11_,"rb","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                    mode_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                           mode_abi_cxx11_);
    }
  }
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(file->_M_dataplus)._M_p,
                     InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                     mode_abi_cxx11_._M_dataplus._M_p);
  pIVar3 = (IOStream *)CONCAT44(extraout_var,iVar2);
  if (pIVar3 != (IOStream *)0x0) {
    iVar2 = (*pIVar3->_vptr_IOStream[6])(pIVar3);
    if (0xf < CONCAT44(extraout_var_00,iVar2)) {
      local_10d8._0_8_ = (IOStream *)0x0;
      local_10d8._8_8_ = 0;
      local_10d8._16_8_ = 0x1000000;
      local_10d8._24_8_ = 0;
      sStack_10b8 = 0;
      local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      sStack_1098 = 0;
      local_1090 = 0;
      std::vector<char,_std::allocator<char>_>::resize(&local_10b0,0x1000000);
      if ((long)local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        memset(local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,10,
               (long)local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
      if ((IOStream *)local_10d8._0_8_ == (IOStream *)0x0) {
        local_10d8._0_8_ = pIVar3;
        iVar2 = (*pIVar3->_vptr_IOStream[6])(pIVar3);
        local_10d8._8_8_ = CONCAT44(extraout_var_01,iVar2);
        if (local_10d8._8_8_ != 0) {
          if ((ulong)local_10d8._8_8_ < (ulong)local_10d8._16_8_) {
            local_10d8._16_8_ = local_10d8._8_8_;
          }
          local_10d8._24_8_ =
               ((ulong)local_10d8._8_8_ / (ulong)local_10d8._16_8_ + 1) -
               (ulong)((ulong)local_10d8._8_8_ % (ulong)local_10d8._16_8_ == 0);
        }
      }
      local_10f8._M_dataplus._M_p = (pointer)&local_10f8.field_2;
      local_10f8._M_string_length = 0;
      local_10f8.field_2._M_local_buf[0] = '\0';
      local_1118 = local_1108;
      local_1110 = 0;
      local_1108[0] = 0;
      lVar4 = std::__cxx11::string::find_last_of((char *)file,0x6cb96e,0xffffffffffffffff);
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_10f8);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1080,(ulong)file);
        std::__cxx11::string::operator=((string *)&local_10f8,(string *)&local_1080);
        if ((unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *)
            local_1080.m_DataIt._M_current != &local_1080.m_pModel) {
          operator_delete(local_1080.m_DataIt._M_current);
        }
        std::__cxx11::string::substr((ulong)&local_1080,(ulong)file);
        std::__cxx11::string::operator=((string *)&local_1118,(string *)&local_1080);
        if ((unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *)
            local_1080.m_DataIt._M_current != &local_1080.m_pModel) {
          operator_delete(local_1080.m_DataIt._M_current);
        }
        if (local_1110 != 0) {
          (*pIOHandler->_vptr_IOSystem[7])(pIOHandler,&local_1118);
        }
      }
      ObjFileParser::ObjFileParser
                (&local_1080,(IOStreamBuffer<char> *)local_10d8,&local_10f8,pIOHandler,
                 (this->super_BaseImporter).m_progress,file);
      pModel = ObjFileParser::GetModel(&local_1080);
      CreateDataFromImport(this,pModel,pScene);
      if ((IOStream *)local_10d8._0_8_ != (IOStream *)0x0) {
        local_10d8._0_8_ = (IOStream *)0x0;
        local_10d8._8_8_ = 0;
        local_10d8._24_8_ = 0;
        sStack_10b8 = 0;
        sStack_1098 = 0;
        local_1090 = 0;
      }
      pcVar1 = (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish != pcVar1) {
        (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar1;
      }
      iVar2 = (*pIOHandler->_vptr_IOSystem[9])(pIOHandler);
      if (CONCAT44(extraout_var_02,iVar2) != 0) {
        (*pIOHandler->_vptr_IOSystem[10])(pIOHandler);
      }
      ObjFileParser::~ObjFileParser(&local_1080);
      if (local_1118 != local_1108) {
        operator_delete(local_1118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
        operator_delete(local_10f8._M_dataplus._M_p);
      }
      if (local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_10b0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      (*pIVar3->_vptr_IOStream[1])(pIVar3);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1080.m_DataIt._M_current = (char *)&local_1080.m_pModel;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1080,"OBJ-file is too small.","");
    std::runtime_error::runtime_error(prVar6,(string *)&local_1080);
    *(undefined ***)prVar6 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10d8,
                 "Failed to open file ",file);
  plVar5 = (long *)std::__cxx11::string::append(local_10d8);
  local_1080.m_DataIt._M_current = (char *)*plVar5;
  p_Var7 = (__uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *)
           (plVar5 + 2);
  if ((__uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_> *)
      local_1080.m_DataIt._M_current == p_Var7) {
    local_1080.m_pModel._M_t.
    super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>._M_t
    .super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
    super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>,_true,_true>
           *)&p_Var7->_M_t;
    local_1080._24_8_ = plVar5[3];
    local_1080.m_DataIt._M_current = (char *)&local_1080.m_pModel;
  }
  else {
    local_1080.m_pModel._M_t.
    super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>._M_t
    .super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>.
    super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>,_true,_true>
           *)&p_Var7->_M_t;
  }
  local_1080.m_DataItEnd._M_current = (char *)plVar5[1];
  *plVar5 = (long)p_Var7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(prVar6,(string *)&local_1080);
  *(undefined ***)prVar6 = &PTR__runtime_error_0081d260;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ObjFileImporter::InternReadFile( const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    static const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream( pIOHandler->Open( file, mode));
    if( !fileStream.get() ) {
        throw DeadlyImportError( "Failed to open file " + file + "." );
    }

    // Get the file-size and validate it, throwing an exception when fails
    size_t fileSize = fileStream->FileSize();
    if( fileSize < ObjMinSize ) {
        throw DeadlyImportError( "OBJ-file is too small.");
    }

    IOStreamBuffer<char> streamedBuffer;
    streamedBuffer.open( fileStream.get() );

    // Allocate buffer and read file into it
    //TextFileToBuffer( fileStream.get(),m_Buffer);

    // Get the model name
    std::string  modelName, folderName;
    std::string::size_type pos = file.find_last_of( "\\/" );
    if ( pos != std::string::npos ) {
        modelName = file.substr(pos+1, file.size() - pos - 1);
        folderName = file.substr( 0, pos );
        if ( !folderName.empty() ) {
            pIOHandler->PushDirectory( folderName );
        }
    } else {
        modelName = file;
    }

    // parse the file into a temporary representation
    ObjFileParser parser( streamedBuffer, modelName, pIOHandler, m_progress, file);

    // And create the proper return structures out of it
    CreateDataFromImport(parser.GetModel(), pScene);

    streamedBuffer.close();

    // Clean up allocated storage for the next import
    m_Buffer.clear();

    // Pop directory stack
    if ( pIOHandler->StackSize() > 0 ) {
        pIOHandler->PopDirectory();
    }
}